

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

PtrTokenOrSyntax * __thiscall
slang::syntax::PackageExportAllDeclarationSyntax::getChildPtr
          (PackageExportAllDeclarationSyntax *this,size_t index)

{
  undefined8 in_RSI;
  long in_RDI;
  SyntaxNode *in_stack_ffffffffffffffb8;
  PtrTokenOrSyntax *in_stack_ffffffffffffffc0;
  PtrTokenOrSyntax *local_10;
  
  switch(in_RSI) {
  case 0:
    PtrTokenOrSyntax::PtrTokenOrSyntax
              ((PtrTokenOrSyntax *)(in_RDI + 0x18),in_stack_ffffffffffffffb8);
    break;
  case 1:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,(Token *)in_stack_ffffffffffffffb8)
    ;
    break;
  case 2:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,(Token *)in_stack_ffffffffffffffb8)
    ;
    break;
  case 3:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,(Token *)in_stack_ffffffffffffffb8)
    ;
    break;
  case 4:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,(Token *)in_stack_ffffffffffffffb8)
    ;
    break;
  case 5:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,(Token *)in_stack_ffffffffffffffb8)
    ;
    break;
  default:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return local_10;
}

Assistant:

PtrTokenOrSyntax PackageExportAllDeclarationSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &keyword;
        case 2: return &star1;
        case 3: return &doubleColon;
        case 4: return &star2;
        case 5: return &semi;
        default: return nullptr;
    }
}